

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O3

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLenum BindTarget,
          bool bIsDeviceInternal)

{
  TEXTURE_FORMAT TexFormat;
  RENDER_DEVICE_TYPE RVar1;
  uint uVar2;
  bool bVar3;
  GLuint GVar4;
  GLenum GVar5;
  int iVar6;
  TextureFormatAttribs *Args;
  long lVar7;
  TextureDesc *pTVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  char *Args_2;
  byte bVar11;
  GLint GlFormat;
  string msg;
  GLint MipLevels;
  GLint TexWidth;
  GLint GlFormat_1;
  string msg_6;
  char (*in_stack_fffffffffffffee8) [2];
  uint local_110;
  uint local_10c;
  undefined1 local_108 [8];
  UniqueIdHelper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [4];
  int local_b4;
  int local_b0;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_ac;
  undefined1 local_a0 [20];
  char acStack_8c [8];
  char local_84 [52];
  GLContextState *local_50;
  TextureDesc *local_48;
  pointer local_40;
  FixedBlockMemoryAllocator *local_38;
  
  bVar11 = 0;
  pTVar8 = TexDesc;
  puVar9 = (undefined8 *)local_a0;
  local_50 = GLState;
  local_40 = (pointer)pRefCounters;
  local_38 = TexViewObjAllocator;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = (pTVar8->super_DeviceObjectAttribs).Name;
    pTVar8 = (TextureDesc *)&pTVar8->Type;
    puVar9 = puVar9 + 1;
  }
  Args_2 = (char *)GLState;
  if (BindTarget == 0x9009) {
    FormatString<char[43]>
              ((string *)local_108,(char (*) [43])"Cubemap arrays are not currently supported");
    DebugAssertionFailed
              ((Char *)local_108,"GetTextureDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x99);
    Args_2 = (char *)GLState;
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      Args_2 = (char *)GLState;
    }
  }
  local_48 = TexDesc;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&local_ac,true,(GLTextureCreateReleaseHelper)GLTextureHandle);
  GLContextState::BindTexture(local_50,-1,BindTarget,&local_ac);
  GVar5 = 0x8515;
  if (BindTarget != 0x8513) {
    GVar5 = BindTarget;
  }
  local_b0 = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_001c0b30:
    glGetTexLevelParameteriv(GVar5,0,0x1000,(char (*) [68])&local_b0);
    local_110 = glGetError();
    if (local_110 != 0) {
      Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_WIDTH) failed";
      LogError<false,char[50],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0xa7,(char (*) [50])"glGetTexLevelParameteriv(GL_TEXTURE_WIDTH) failed",
                 (char (*) [17])"\nGL Error Code: ",&local_110);
      FormatString<char[6]>((string *)local_108,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                ((Char *)local_108,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0xa7);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    if (local_b0 < 1) goto LAB_001c0c7c;
    if (local_a0._12_4_ != local_b0 && local_a0._12_4_ != 0) {
      Args_2 = local_a0;
      FormatString<char[12],unsigned_int,char[15],char_const*,char[68],int,char[2]>
                ((string *)local_108,(Diligent *)"The width (",(char (*) [12])(local_a0 + 0xc),
                 (uint *)") of texture \'",(char (*) [15])Args_2,
                 (char **)"\' specified by TextureDesc struct does not match the actual width (",
                 (char (*) [68])&local_b0,(int *)0x343766,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_108,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    local_a0._12_4_ = local_b0;
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar3 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar3 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar3) goto LAB_001c0b30;
    }
LAB_001c0c7c:
    if (local_a0._12_4_ == 0) {
      FormatString<char[39],char_const*,char[53]>
                ((string *)local_108,(Diligent *)"Unable to query the width of texture \'",
                 (char (*) [39])local_a0,
                 (char **)"\' while the Width member of TextureDesc struct is 0.",
                 (char (*) [53])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_108,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
  }
  if (local_a0[8] < 4) {
    local_a0._16_4_ = 1;
  }
  else {
    local_110 = 0;
    RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
    if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_001c0d35:
      glGetTexLevelParameteriv(GVar5,0,0x1001,(char (*) [69])&local_110);
      local_10c = glGetError();
      if (local_10c != 0) {
        Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_HEIGHT) failed";
        LogError<false,char[51],char[17],unsigned_int>
                  (false,"GetTextureDescFromGLHandle",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0xcb,(char (*) [51])"glGetTexLevelParameteriv(GL_TEXTURE_HEIGHT) failed",
                   (char (*) [17])"\nGL Error Code: ",&local_10c);
        FormatString<char[6]>((string *)local_108,(char (*) [6])0x32e52e);
        DebugAssertionFailed
                  ((Char *)local_108,"GetTextureDescFromGLHandle",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0xcb);
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
        }
      }
      if ((int)local_110 < 1) goto LAB_001c0e91;
      if (local_a0._16_4_ != local_110 && local_a0._16_4_ != 0) {
        Args_2 = local_a0;
        FormatString<char[13],unsigned_int,char[15],char_const*,char[69],int,char[2]>
                  ((string *)local_108,(Diligent *)"The height (",(char (*) [13])(local_a0 + 0x10),
                   (uint *)") of texture \'",(char (*) [15])Args_2,
                   (char **)"\' specified by TextureDesc struct does not match the actual height (",
                   (char (*) [69])&local_110,(int *)0x343766,in_stack_fffffffffffffee8);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,local_108,0,0);
        }
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
        }
      }
      local_a0._16_4_ = local_110;
    }
    else {
      if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
        uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Major;
        bVar3 = 2 < uVar2;
        if (uVar2 == 3) {
          bVar3 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor != 0;
        }
        if (bVar3) goto LAB_001c0d35;
      }
LAB_001c0e91:
      if (local_a0._16_4_ == 0) {
        FormatString<char[40],char_const*,char[54]>
                  ((string *)local_108,(Diligent *)"Unable to query the height of texture \'",
                   (char (*) [40])local_a0,
                   (char **)"\' while the Height member of TextureDesc struct is 0.",
                   (char (*) [54])Args_2);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,local_108,0,0);
        }
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
        }
      }
    }
    if (local_a0[8] == 6) {
      local_110 = 0;
      RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
      if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_001c0f4a:
        glGetTexLevelParameteriv(GVar5,0,0x8071,(char (*) [68])&local_110);
        local_10c = glGetError();
        if (local_10c != 0) {
          Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_DEPTH) failed";
          LogError<false,char[50],char[17],unsigned_int>
                    (false,"GetTextureDescFromGLHandle",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0xf2,(char (*) [50])"glGetTexLevelParameteriv(GL_TEXTURE_DEPTH) failed",
                     (char (*) [17])"\nGL Error Code: ",&local_10c);
          FormatString<char[6]>((string *)local_108,(char (*) [6])0x32e52e);
          DebugAssertionFailed
                    ((Char *)local_108,"GetTextureDescFromGLHandle",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0xf2);
          if (local_108 != (undefined1  [8])local_f8) {
            operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
          }
        }
        if (0 < (int)local_110) {
          if (acStack_8c._0_4_ != local_110 && acStack_8c._0_4_ != 0) {
            Args_2 = local_a0;
            FormatString<char[12],unsigned_int,char[15],char_const*,char[68],int,char[2]>
                      ((string *)local_108,(Diligent *)"The depth (",(char (*) [12])acStack_8c,
                       (uint *)") of texture \'",(char (*) [15])Args_2,
                       (char **)
                       "\' specified by TextureDesc struct does not match the actual depth (",
                       (char (*) [68])&local_110,(int *)0x343766,in_stack_fffffffffffffee8);
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char *)0x0;
              (*(code *)DebugMessageCallback)(1,local_108,0,0);
            }
            if (local_108 != (undefined1  [8])local_f8) {
              operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
            }
          }
          acStack_8c[0] = (undefined1)local_110;
          acStack_8c[1] = local_110._1_1_;
          acStack_8c[2] = local_110._2_1_;
          acStack_8c[3] = local_110._3_1_;
          goto LAB_001c1104;
        }
      }
      else if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
        uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Major;
        bVar3 = 2 < uVar2;
        if (uVar2 == 3) {
          bVar3 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor != 0;
        }
        if (bVar3) goto LAB_001c0f4a;
      }
      if (acStack_8c._0_4_ == 0) {
        FormatString<char[39],char_const*,char[53]>
                  ((string *)local_108,(Diligent *)"Unable to query the depth of texture \'",
                   (char (*) [39])local_a0,
                   (char **)"\' while the Depth member of TextureDesc struct is 0.",
                   (char (*) [53])Args_2);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,local_108,0,0);
        }
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
LAB_001c1104:
  if ((local_a0[8] == 4) || (local_a0[8] == 2)) {
    acStack_8c[0] = '\x01';
    acStack_8c[1] = '\0';
    acStack_8c[2] = '\0';
    acStack_8c[3] = '\0';
  }
  local_10c = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_001c115e:
    glGetTexLevelParameteriv(GVar5,0,0x1003,(char (*) [78])&local_10c);
    local_110 = glGetError();
    if (local_110 != 0) {
      Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed";
      LogError<false,char[60],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x116,(char (*) [60])"glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed"
                 ,(char (*) [17])"\nGL Error Code: ",&local_110);
      FormatString<char[6]>((string *)local_108,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                ((Char *)local_108,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x116);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    uVar2 = local_10c;
    if (local_10c == 0) goto LAB_001c12c5;
    if ((acStack_8c._4_2_ != TEX_FORMAT_UNKNOWN) &&
       (GVar5 = TexFormatToGLInternalTexFormat(acStack_8c._4_2_,0), uVar2 != GVar5)) {
      Args = GetTextureFormatAttribs(acStack_8c._4_2_);
      Args_2 = local_a0;
      FormatString<char[13],char_const*,char[15],char_const*,char[78],int,char[2]>
                ((string *)local_108,(Diligent *)"The format (",(char (*) [13])Args,
                 (char **)") of texture \'",(char (*) [15])Args_2,
                 (char **)
                 "\' specified by TextureDesc struct does not match GL texture internal format (",
                 (char (*) [78])&local_10c,(int *)0x343766,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_108,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    acStack_8c._4_2_ = GLInternalTexFormatToTexFormat(local_10c);
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar3 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar3 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar3) goto LAB_001c115e;
    }
LAB_001c12c5:
    if (acStack_8c._4_2_ == TEX_FORMAT_UNKNOWN) {
      FormatString<char[40],char_const*,char[71]>
                ((string *)local_108,(Diligent *)"Unable to query the format of texture \'",
                 (char (*) [40])local_a0,
                 (char **)"\' while the Format member of TextureDesc struct is TEX_FORMAT_UNKNOWN.",
                 (char (*) [71])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_108,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
  }
  local_b4 = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
LAB_001c1370:
    glGetTexParameteriv(BindTarget,0x82df,(char (*) [83])&local_b4);
    local_110 = glGetError();
    if (local_110 != 0) {
      Args_2 = "glGetTexParameteriv(GL_TEXTURE_IMMUTABLE_LEVELS) failed";
      LogError<false,char[56],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x137,(char (*) [56])"glGetTexParameteriv(GL_TEXTURE_IMMUTABLE_LEVELS) failed",
                 (char (*) [17])"\nGL Error Code: ",&local_110);
      FormatString<char[6]>((string *)local_108,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                ((Char *)local_108,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x137);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    if (local_b4 < 1) goto LAB_001c14b9;
    if (local_84._0_4_ != local_b4 && local_84._0_4_ != 0) {
      FormatString<char[27],unsigned_int,char[15],char_const*,char[83],int,char[2]>
                ((string *)local_108,(Diligent *)"The number of mip levels (",
                 (char (*) [27])local_84,(uint *)") of texture \'",(char (*) [15])local_a0,
                 (char **)
                 "\' specified by TextureDesc struct does not match the actual number of mip levels ("
                 ,(char (*) [83])&local_b4,(int *)0x343766,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_108,0,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
    local_84[0] = (undefined1)local_b4;
    local_84[1] = local_b4._1_1_;
    local_84[2] = local_b4._2_1_;
    local_84[3] = local_b4._3_1_;
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GL) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar3 = 3 < uVar2;
      if (uVar2 == 4) {
        bVar3 = 2 < (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                    APIVersion.Minor;
      }
      if (bVar3) goto LAB_001c1370;
    }
LAB_001c14b9:
    if (local_84._0_4_ == 0) {
      FormatString<char[49],char_const*,char[57]>
                ((string *)local_108,(Diligent *)"Unable to query the mip level count of texture \'"
                 ,(char (*) [49])local_a0,
                 (char **)"\' while the MipLevels member of TextureDesc struct is 0.",
                 (char (*) [57])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_108,0,0,0);
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
    }
  }
  local_108 = (undefined1  [8])0x0;
  local_100.m_ID = 0;
  GLContextState::BindTexture(local_50,-1,BindTarget,(GLTextureObj *)local_108);
  if (local_108._0_4_ != 0) {
    local_110 = local_108._0_4_;
    if (local_108._4_4_ == 0) {
      glDeleteTextures(1,&local_110);
    }
  }
  puVar9 = (undefined8 *)local_a0;
  puVar10 = (undefined8 *)local_108;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  if ((local_ac.m_uiHandle != 0) &&
     (local_110 = local_ac.m_uiHandle, local_ac.m_CreateReleaseHelper.m_ExternalGLTextureHandle == 0
     )) {
    glDeleteTextures(1,&local_110);
  }
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,(IReferenceCounters *)local_40,
             local_38,pDeviceGL,(TextureDesc *)local_108,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00428460;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,true,(GLTextureCreateReleaseHelper)GLTextureHandle);
  (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  this->m_BindTarget = BindTarget;
  TexFormat = local_48->Format;
  GLContextState::BindTexture(local_50,-1,BindTarget,&this->m_GlTexture);
  GVar5 = BindTarget;
  if (BindTarget == 0x9009) {
    GVar5 = 0x8515;
  }
  local_ac.m_uiHandle = 0;
  if (BindTarget == 0x8513) {
    GVar5 = 0x8515;
  }
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_001c168f:
    glGetTexLevelParameteriv(GVar5,0,0x1003,&local_ac);
    iVar6 = glGetError();
    local_108._0_4_ = iVar6;
    if (iVar6 != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"GetTextureInternalFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x68,(char (*) [60])"glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)local_108);
      FormatString<char[6]>((string *)local_a0,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                ((Char *)local_a0._0_8_,"GetTextureInternalFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x68);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,CONCAT44(acStack_8c._0_4_,local_a0._16_4_) + 1);
      }
    }
    if (local_ac.m_uiHandle == 0) goto LAB_001c17a7;
    if (local_ac.m_uiHandle == 0x1908) {
      local_ac.m_uiHandle = 0x8058;
    }
    GVar4 = local_ac.m_uiHandle;
    if ((TexFormat == TEX_FORMAT_UNKNOWN) ||
       (GVar5 = TexFormatToGLInternalTexFormat(TexFormat,0), GVar4 == GVar5)) goto LAB_001c1818;
    FormatString<char[78]>
              ((string *)local_a0,
               (char (*) [78])
               "Texture format does not match the format specified by the texture description");
    DebugAssertionFailed
              ((Char *)local_a0._0_8_,"GetTextureInternalFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x74);
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar3 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar3 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar3) goto LAB_001c168f;
    }
LAB_001c17a7:
    if (TexFormat != TEX_FORMAT_UNKNOWN) {
      local_ac.m_uiHandle = TexFormatToGLInternalTexFormat(TexFormat,0);
      goto LAB_001c1818;
    }
    FormatString<char[113]>
              ((string *)local_a0,
               (char (*) [113])
               "Unable to query internal texture format while the format specified by texture description is TEX_FORMAT_UNKNOWN."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_a0._0_8_,0,0,0);
    }
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT44(acStack_8c._0_4_,local_a0._16_4_) + 1);
  }
LAB_001c1818:
  local_a0._0_8_ = (pointer)0x0;
  local_a0._8_4_ = 0;
  GLContextState::BindTexture(local_50,-1,BindTarget,(GLTextureObj *)local_a0);
  if (local_a0._0_4_ != 0) {
    local_108._0_4_ = local_a0._0_4_;
    if (local_a0._4_4_ == 0) {
      glDeleteTextures(1,local_108);
    }
  }
  this->m_GLTexFormat = local_ac.m_uiHandle;
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             GLContextState&            GLState,
                             const TextureDesc&         TexDesc,
                             GLuint                     GLTextureHandle,
                             GLenum                     BindTarget,
                             bool                       bIsDeviceInternal /* = false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GetTextureDescFromGLHandle(pDeviceGL->GetDeviceInfo(), GLState, TexDesc, GLTextureHandle, BindTarget),
        bIsDeviceInternal
    },
    // Create texture object wrapper, but use external texture handle
    m_GlTexture     {true, GLObjectWrappers::GLTextureCreateReleaseHelper(GLTextureHandle)},
    m_BindTarget    {BindTarget},
    m_GLTexFormat   {GetTextureInternalFormat(pDeviceGL->GetDeviceInfo(), GLState, BindTarget, m_GlTexture, TexDesc.Format)}
// clang-format on
{
}